

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgHierarchyManipulator.cpp
# Opt level: O3

void TasGrid::HierarchyManipulations::completeToLower<(TasGrid::RuleLocal::erule)1>
               (MultiIndexSet *mset,MultiIndexSet *refined)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  int *p;
  int *piVar4;
  long lVar5;
  bool bVar6;
  vector<int,_std::allocator<int>_> parent;
  allocator_type local_91;
  undefined1 local_90 [16];
  vector<int,_std::allocator<int>_> local_80;
  size_t local_68;
  undefined1 local_60 [16];
  pointer piStack_50;
  pointer local_48;
  pointer piStack_40;
  long local_38;
  
  local_68 = mset->num_dimensions;
  do {
    local_60._0_8_ = local_68;
    local_48 = (pointer)0x0;
    piStack_40 = (pointer)0x0;
    local_60._8_8_ = 0;
    piStack_50 = (pointer)0x0;
    local_38 = (long)refined->cache_num_indexes;
    if (local_38 < 1) {
      bVar6 = true;
    }
    else {
      lVar5 = 0;
      do {
        piVar4 = (refined->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + refined->num_dimensions * lVar5;
        ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
                  ((vector<int,std::allocator<int>> *)local_90,piVar4,piVar4 + local_68,&local_91);
        uVar2 = local_90._8_8_;
        for (piVar4 = (int *)local_90._0_8_; piVar4 != (int *)uVar2; piVar4 = piVar4 + 1) {
          iVar1 = *piVar4;
          iVar3 = ((iVar1 - (iVar1 + 1 >> 0x1f)) + 1 >> 1) - (uint)(iVar1 < 4);
          *piVar4 = iVar3;
          if (((iVar3 != -1) &&
              (iVar3 = MultiIndexSet::getSlot(refined,(int *)local_90._0_8_), iVar3 == -1)) &&
             (iVar3 = MultiIndexSet::getSlot(mset,(int *)local_90._0_8_), iVar3 == -1)) {
            ::std::vector<int,std::allocator<int>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                      ((vector<int,std::allocator<int>> *)&piStack_50,local_48,local_90._0_8_,
                       (int *)(local_90._0_8_ + local_60._0_8_ * 4));
            local_60._8_8_ = local_60._8_8_ + 1;
          }
          *piVar4 = iVar1;
        }
        if ((int *)local_90._0_8_ != (int *)0x0) {
          operator_delete((void *)local_90._0_8_,
                          (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start - local_90._0_8_);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != local_38);
      bVar6 = local_60._8_4_ == 0;
      if (!bVar6) {
        MultiIndexSet::MultiIndexSet((MultiIndexSet *)local_90,(Data2D<int> *)local_60);
        refined->num_dimensions = local_90._0_8_;
        MultiIndexSet::addSortedIndexes(refined,&local_80);
        if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
    }
    if (piStack_50 != (pointer)0x0) {
      operator_delete(piStack_50,(long)piStack_40 - (long)piStack_50);
    }
  } while (!bVar6);
  return;
}

Assistant:

void completeToLower(MultiIndexSet const &mset, MultiIndexSet &refined){
    size_t num_dimensions = mset.getNumDimensions();
    size_t num_added = 1; // set to 1 to start the loop
    while(num_added > 0){
        Data2D<int> addons(num_dimensions, 0);
        int num_points = refined.getNumIndexes();

        for(int i=0; i<num_points; i++){
            std::vector<int> parent(refined.getIndex(i), refined.getIndex(i) + num_dimensions);
            for(auto &p : parent){
                int r = p;
                p = RuleLocal::getParent<effrule>(r);
                if ((p != -1) && refined.missing(parent) && mset.missing(parent))
                    addons.appendStrip(parent);
                p = RuleLocal::getStepParent<effrule>(r);
                if ((p != -1) && refined.missing(parent) && mset.missing(parent))
                    addons.appendStrip(parent);
                p = r;
            }
        }

        num_added = addons.getNumStrips();
        if (num_added > 0) refined += addons;
    }
}